

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O3

void __thiscall Js::PropertyDescriptor::PropertyDescriptor(PropertyDescriptor *this)

{
  *(undefined8 *)((long)&(this->originalVar).ptr + 2) = 0;
  this->configurableSpecified = false;
  this->valueSpecified = false;
  this->getterSpecified = false;
  this->setterSpecified = false;
  this->Writable = false;
  this->Enumerable = false;
  this->Configurable = false;
  this->fromProxy = false;
  (this->Setter).ptr = (void *)0x0;
  (this->originalVar).ptr = (void *)0x0;
  (this->Value).ptr = (void *)0x0;
  (this->Getter).ptr = (void *)0x0;
  return;
}

Assistant:

PropertyDescriptor::PropertyDescriptor() :
        writableSpecified(false),
        enumerableSpecified(false),
        configurableSpecified(false),
        valueSpecified(false),
        getterSpecified(false),
        setterSpecified(false),
        Writable(false),
        Enumerable(false),
        Configurable(false),
        Value(nullptr),
        Getter(nullptr),
        Setter(nullptr),
        originalVar(nullptr),
        fromProxy(false)
    {
    }